

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_body.hpp
# Opt level: O3

void iutest::Test::RecordProperty<int>(string *key,int *value)

{
  string local_1c0;
  undefined1 local_1a0 [32];
  _Alloc_hider local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170 [5];
  ios_base local_120 [264];
  
  iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1a0);
  std::ostream::operator<<(local_1a0 + 0x10,*value);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
  std::ios_base::~ios_base(local_120);
  TestProperty::TestProperty((TestProperty *)local_1a0,key,&local_1c0);
  UnitTestImpl::RecordProperty((TestProperty *)local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_p != local_170) {
    operator_delete(local_180._M_p,local_170[0]._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
    operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

static void RecordProperty(const ::std::string& key, const T& value)
    {
        RecordPropertyString(key, PrintToString(value));
    }